

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToDOT.cpp
# Opt level: O2

void __thiscall
OpenMPAlignedClause::generateDOT
          (OpenMPAlignedClause *this,ofstream *dot_file,int depth,int index,string *parent_node)

{
  bool bVar1;
  pointer ppcVar2;
  allocator<char> local_1e9;
  ofstream *local_1e8;
  int local_1dc;
  string alignment;
  string local_1b0;
  string alignment_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string parameter_string;
  string indent;
  string current_line;
  string clause_kind;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
  current_line._M_string_length = 0;
  current_line.field_2._M_local_buf[0] = '\0';
  indent._M_dataplus._M_p = (pointer)&indent.field_2;
  local_1e8 = dot_file;
  std::__cxx11::string::_M_construct((ulong)&indent,(char)depth);
  std::__cxx11::to_string(&alignment_name,depth);
  std::operator+(&alignment,"aligned_",&alignment_name);
  std::operator+(&parameter_string,&alignment,"_");
  std::__cxx11::to_string(&local_1b0,index);
  std::operator+(&clause_kind,&parameter_string,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&alignment);
  std::__cxx11::string::~string((string *)&alignment_name);
  std::operator+(&local_1b0,&indent,parent_node);
  std::operator+(&alignment_name,&local_1b0,"-- ");
  std::operator+(&alignment,&alignment_name,&clause_kind);
  std::operator+(&parameter_string,&alignment,"\n");
  std::__cxx11::string::operator=((string *)&current_line,(string *)&parameter_string);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&alignment);
  std::__cxx11::string::~string((string *)&alignment_name);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&indent);
  parameter_string._M_dataplus._M_p = (pointer)&parameter_string.field_2;
  parameter_string._M_string_length = 0;
  alignment._M_dataplus._M_p = (pointer)&alignment.field_2;
  alignment._M_string_length = 0;
  parameter_string.field_2._M_local_buf[0] = '\0';
  local_1dc = 0;
  alignment.field_2._M_local_buf[0] = '\0';
  for (ppcVar2 = (this->super_OpenMPClause).expressions.
                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar2 !=
      (this->super_OpenMPClause).expressions.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar2 = ppcVar2 + 1) {
    std::operator+(&local_1b0,&clause_kind,"_expr");
    std::__cxx11::to_string(&local_150,local_1dc);
    std::operator+(&alignment_name,&local_1b0,&local_150);
    std::__cxx11::string::operator=((string *)&alignment,(string *)&alignment_name);
    std::__cxx11::string::~string((string *)&alignment_name);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::operator+(&local_170,&indent,&clause_kind);
    std::operator+(&local_150,&local_170," -- ");
    std::operator+(&local_1b0,&local_150,&alignment);
    std::operator+(&alignment_name,&local_1b0,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&alignment_name);
    std::__cxx11::string::~string((string *)&alignment_name);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
    std::operator+(&local_70,&indent,"\t");
    std::operator+(&local_50,&local_70,&alignment);
    std::operator+(&local_130,&local_50," [label = \"");
    std::operator+(&local_170,&local_130,&alignment);
    std::operator+(&local_150,&local_170,"\\n ");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,*ppcVar2,&local_1e9);
    std::operator+(&local_1b0,&local_150,&local_90);
    std::operator+(&alignment_name,&local_1b0,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&alignment_name);
    std::__cxx11::string::~string((string *)&alignment_name);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
    local_1dc = local_1dc + 1;
  }
  std::__cxx11::string::~string((string *)&alignment);
  std::__cxx11::string::string((string *)&alignment,(string *)&this->user_defined_alignment);
  bVar1 = std::operator!=(&alignment,"");
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)&parameter_string);
    std::operator+(&alignment_name,&clause_kind,"_aligned_alignment");
    std::operator+(&local_130,&indent,&clause_kind);
    std::operator+(&local_170,&local_130," -- ");
    std::operator+(&local_150,&local_170,&alignment_name);
    std::operator+(&local_1b0,&local_150,"\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
    std::operator+(&local_90,&indent,"\t");
    std::operator+(&local_70,&local_90,&alignment_name);
    std::operator+(&local_50,&local_70," [label = \"");
    std::operator+(&local_130,&local_50,&alignment_name);
    std::operator+(&local_170,&local_130,"\\n ");
    std::operator+(&local_150,&local_170,&parameter_string);
    std::operator+(&local_1b0,&local_150,"\"]\n");
    std::__cxx11::string::operator=((string *)&current_line,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::operator<<((ostream *)local_1e8,current_line._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&alignment_name);
  }
  std::__cxx11::string::~string((string *)&alignment);
  std::__cxx11::string::~string((string *)&parameter_string);
  std::__cxx11::string::~string((string *)&clause_kind);
  std::__cxx11::string::~string((string *)&indent);
  std::__cxx11::string::~string((string *)&current_line);
  return;
}

Assistant:

void OpenMPAlignedClause::generateDOT(std::ofstream& dot_file, int depth, int index, std::string parent_node) {

    std::string current_line;
    std::string indent = std::string(depth, '\t');

    std::string clause_kind = "aligned_" + std::to_string(depth) + "_" + std::to_string(index);
    current_line = indent + parent_node + "-- " + clause_kind + "\n";
    dot_file << current_line.c_str();
    indent += "\t";
    std::string parameter_string;

    std::vector<const char*>* expr = this->getExpressions();
    if (expr != NULL) {
        std::vector<const char*>::iterator it;
        int expr_index = 0;
        std::string expr_name;
        for (it = expr->begin(); it != expr->end(); it++) {
            expr_name = clause_kind + "_expr" + std::to_string(expr_index);
            expr_index += 1;
            current_line = indent + clause_kind + " -- " + expr_name + "\n";
            dot_file << current_line.c_str();
            current_line = indent + "\t" + expr_name + " [label = \"" + expr_name + "\\n " + std::string(*it) + "\"]\n";
            dot_file << current_line.c_str();
        };
    };
    std::string alignment = this->getUserDefinedAlignment();
    if (alignment != "") {
        parameter_string = alignment;
        std::string alignment_name = clause_kind + "_aligned_alignment";
        current_line = indent + clause_kind + " -- " + alignment_name + "\n";
        dot_file << current_line.c_str();
        current_line = indent + "\t" + alignment_name + " [label = \"" + alignment_name + "\\n " + parameter_string + "\"]\n";
        dot_file << current_line.c_str();
    };    

}